

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *sdata_00;
  idx_t slen_00;
  bool bVar7;
  
  if (slen != 0 && plen != 0) {
    uVar4 = 0;
    uVar6 = 0;
    do {
      cVar1 = pdata[uVar4];
      if (cVar1 == '_') {
        if (slen <= uVar6 + 1) {
          uVar6 = uVar6 + 1;
          if (uVar6 < slen) {
            uVar6 = slen;
          }
          uVar4 = uVar4 + 1;
          goto LAB_009f5d3e;
        }
      }
      else {
        if (cVar1 == '%') {
          do {
            uVar5 = uVar4 + 1;
            if (plen <= uVar5) {
              return true;
            }
            lVar2 = uVar4 + 1;
            uVar4 = uVar5;
          } while (pdata[lVar2] == '%');
          if (plen - uVar5 != 0) {
            if (slen < uVar6 || slen - uVar6 == 0) {
              return false;
            }
            sdata_00 = sdata + uVar6;
            slen_00 = slen - uVar6;
            do {
              bVar3 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                (sdata_00,slen_00,pdata + uVar5,plen - uVar5,escape);
              if (bVar3) {
                return bVar3;
              }
              sdata_00 = sdata_00 + 1;
              bVar7 = slen_00 != 1;
              slen_00 = slen_00 - 1;
            } while (bVar7);
            return bVar3;
          }
          return true;
        }
        if (cVar1 != sdata[uVar6]) {
          return false;
        }
      }
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 + 1;
      if ((plen <= uVar4) || (slen <= uVar6)) goto LAB_009f5d3e;
    } while( true );
  }
  uVar6 = 0;
  uVar4 = 0;
LAB_009f5d3e:
  uVar5 = uVar4;
  if (uVar4 < plen) {
    do {
      uVar5 = uVar4;
      if (pdata[uVar4] != '%') break;
      uVar4 = uVar4 + 1;
      uVar5 = plen;
    } while (plen != uVar4);
  }
  return uVar6 == slen && uVar5 == plen;
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}